

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::GenerateTargetInstallRules
          (cmLocalGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurationTypes)

{
  bool *path;
  bool bVar1;
  TargetType TVar2;
  GeneratorTargetVector *this_00;
  pointer pcVar3;
  ulong uVar4;
  string *psVar5;
  cmListFileBacktrace local_5d8;
  allocator<char> local_5b9;
  string local_5b8;
  string local_598;
  undefined1 local_578 [8];
  cmInstallScriptGenerator g_3;
  string local_470;
  cmValue local_450;
  cmValue postinstall;
  cmInstallTargetGeneratorLocal g_2;
  cmInstallTargetGeneratorLocal g_1;
  string destination;
  allocator<char> local_1d1;
  string local_1d0;
  string local_1b0;
  undefined1 local_190 [8];
  cmInstallScriptGenerator g;
  allocator<char> local_79;
  string local_78;
  cmValue local_58;
  cmValue preinstall;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *l;
  const_iterator __end1;
  const_iterator __begin1;
  GeneratorTargetVector *__range1;
  GeneratorTargetVector *tgts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurationTypes_local;
  string *config_local;
  ostream *os_local;
  cmLocalGenerator *this_local;
  
  this_00 = GetGeneratorTargets(this);
  __end1 = std::
           vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ::begin(this_00);
  l = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
      std::
      vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
      ::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                *)&l);
    if (!bVar1) {
      return;
    }
    preinstall.Value =
         (string *)
         __gnu_cxx::
         __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
         ::operator*(&__end1);
    pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::operator->
                       ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                        preinstall.Value);
    TVar2 = cmGeneratorTarget::GetType(pcVar3);
    if (TVar2 != INTERFACE_LIBRARY) {
      pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
               operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                          preinstall.Value);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"PRE_INSTALL_SCRIPT",&local_79);
      local_58 = cmGeneratorTarget::GetProperty(pcVar3,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      bVar1 = cmValue::operator_cast_to_bool(&local_58);
      if (bVar1) {
        psVar5 = cmValue::operator*[abi_cxx11_(&local_58);
        std::__cxx11::string::string((string *)&local_1b0,(string *)psVar5);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"",&local_1d1);
        destination.field_2._8_8_ = 0;
        cmListFileBacktrace::cmListFileBacktrace
                  ((cmListFileBacktrace *)((long)&destination.field_2 + 8));
        cmInstallScriptGenerator::cmInstallScriptGenerator
                  ((cmInstallScriptGenerator *)local_190,&local_1b0,false,&local_1d0,false,false,
                   (cmListFileBacktrace *)((long)&destination.field_2 + 8));
        cmListFileBacktrace::~cmListFileBacktrace
                  ((cmListFileBacktrace *)((long)&destination.field_2 + 8));
        std::__cxx11::string::~string((string *)&local_1d0);
        std::allocator<char>::~allocator(&local_1d1);
        std::__cxx11::string::~string((string *)&local_1b0);
        cmScriptGenerator::Generate((cmScriptGenerator *)local_190,os,config,configurationTypes);
        cmInstallScriptGenerator::~cmInstallScriptGenerator((cmInstallScriptGenerator *)local_190);
      }
      pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
               operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                          preinstall.Value);
      cmTarget::GetInstallPath_abi_cxx11_(pcVar3->Target);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                 operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             *)preinstall.Value);
        psVar5 = cmTarget::GetInstallPath_abi_cxx11_(pcVar3->Target);
        path = &g_1.super_cmInstallTargetGenerator.ImportLibrary;
        std::__cxx11::string::substr((ulong)path,(ulong)psVar5);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)path);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) != 0) {
          std::__cxx11::string::operator=
                    ((string *)&g_1.super_cmInstallTargetGenerator.ImportLibrary,".");
        }
        pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                 operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             *)preinstall.Value);
        TVar2 = cmGeneratorTarget::GetType(pcVar3);
        if (TVar2 < SHARED_LIBRARY) {
LAB_00200650:
          pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                   operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               *)preinstall.Value);
          psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar3);
          cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)
                     &g_2.super_cmInstallTargetGenerator.ImportLibrary,this,psVar5,
                     (string *)&g_1.super_cmInstallTargetGenerator.ImportLibrary,false);
          cmScriptGenerator::Generate
                    ((cmScriptGenerator *)&g_2.super_cmInstallTargetGenerator.ImportLibrary,os,
                     config,configurationTypes);
          cmInstallTargetGeneratorLocal::~cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)
                     &g_2.super_cmInstallTargetGenerator.ImportLibrary);
        }
        else if (TVar2 == SHARED_LIBRARY) {
          pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                   operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               *)preinstall.Value);
          psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar3);
          cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)&postinstall,this,psVar5,
                     (string *)&g_1.super_cmInstallTargetGenerator.ImportLibrary,false);
          cmScriptGenerator::Generate
                    ((cmScriptGenerator *)&postinstall,os,config,configurationTypes);
          cmInstallTargetGeneratorLocal::~cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)&postinstall);
        }
        else if (TVar2 == MODULE_LIBRARY) goto LAB_00200650;
        std::__cxx11::string::~string((string *)&g_1.super_cmInstallTargetGenerator.ImportLibrary);
      }
      pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
               operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                          preinstall.Value);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"POST_INSTALL_SCRIPT",(allocator<char> *)&g_3.field_0xff);
      local_450 = cmGeneratorTarget::GetProperty(pcVar3,&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::allocator<char>::~allocator((allocator<char> *)&g_3.field_0xff);
      bVar1 = cmValue::operator_cast_to_bool(&local_450);
      if (bVar1) {
        psVar5 = cmValue::operator*[abi_cxx11_(&local_450);
        std::__cxx11::string::string((string *)&local_598,(string *)psVar5);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"",&local_5b9);
        local_5d8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_5d8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmListFileBacktrace::cmListFileBacktrace(&local_5d8);
        cmInstallScriptGenerator::cmInstallScriptGenerator
                  ((cmInstallScriptGenerator *)local_578,&local_598,false,&local_5b8,false,false,
                   &local_5d8);
        cmListFileBacktrace::~cmListFileBacktrace(&local_5d8);
        std::__cxx11::string::~string((string *)&local_5b8);
        std::allocator<char>::~allocator(&local_5b9);
        std::__cxx11::string::~string((string *)&local_598);
        cmScriptGenerator::Generate((cmScriptGenerator *)local_578,os,config,configurationTypes);
        cmInstallScriptGenerator::~cmInstallScriptGenerator((cmInstallScriptGenerator *)local_578);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmLocalGenerator::GenerateTargetInstallRules(
  std::ostream& os, const std::string& config,
  std::vector<std::string> const& configurationTypes)
{
  // Convert the old-style install specification from each target to
  // an install generator and run it.
  const auto& tgts = this->GetGeneratorTargets();
  for (const auto& l : tgts) {
    if (l->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    // Include the user-specified pre-install script for this target.
    if (cmValue preinstall = l->GetProperty("PRE_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(*preinstall, false, "", false, false);
      g.Generate(os, config, configurationTypes);
    }

    // Install this target if a destination is given.
    if (!l->Target->GetInstallPath().empty()) {
      // Compute the full install destination.  Note that converting
      // to unix slashes also removes any trailing slash.
      // We also skip over the leading slash given by the user.
      std::string destination = l->Target->GetInstallPath().substr(1);
      cmSystemTools::ConvertToUnixSlashes(destination);
      if (destination.empty()) {
        destination = ".";
      }

      // Generate the proper install generator for this target type.
      switch (l->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY: {
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, l->GetName(), destination,
                                          false);
          g.Generate(os, config, configurationTypes);
        } break;
        case cmStateEnums::SHARED_LIBRARY: {
#if defined(_WIN32) || defined(__CYGWIN__)
          // Special code to handle DLL.  Install the import library
          // to the normal destination and the DLL to the runtime
          // destination.
          cmInstallTargetGeneratorLocal g1(this, l->GetName(), destination,
                                           true);
          g1.Generate(os, config, configurationTypes);
          // We also skip over the leading slash given by the user.
          destination = l->Target->GetRuntimeInstallPath().substr(1);
          cmSystemTools::ConvertToUnixSlashes(destination);
          cmInstallTargetGeneratorLocal g2(this, l->GetName(), destination,
                                           false);
          g2.Generate(os, config, configurationTypes);
#else
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, l->GetName(), destination,
                                          false);
          g.Generate(os, config, configurationTypes);
#endif
        } break;
        default:
          break;
      }
    }

    // Include the user-specified post-install script for this target.
    if (cmValue postinstall = l->GetProperty("POST_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(*postinstall, false, "", false, false);
      g.Generate(os, config, configurationTypes);
    }
  }
}